

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_31::PromiseIoStream::pumpTo
          (PromiseIoStream *this,AsyncOutputStream *output,uint64_t amount)

{
  _func_int **pp_Var1;
  TransformPromiseNodeBase *this_00;
  PromiseNode *in_RCX;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar2;
  Promise<unsigned_long> PVar3;
  Own<kj::_::PromiseNode> OStack_68;
  Own<kj::_::PromiseNode> intermediate;
  Own<kj::_::PromiseNode> local_48;
  Own<kj::_::PromiseNode> local_38;
  
  pp_Var1 = output[6]._vptr_AsyncOutputStream;
  if (pp_Var1 == (_func_int **)0x0) {
    ForkedPromise<void>::addBranch((ForkedPromise<void> *)&OStack_68);
    this_00 = (TransformPromiseNodeBase *)operator_new(0x40);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&OStack_68,
               _::
               TransformPromiseNode<kj::Promise<unsigned_long>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:3428:39),_kj::_::PropagateException>
               ::anon_class_24_3_31b3e6fc_for_func::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_0042a700;
    this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)output;
    this_00[1].dependency.disposer = (Disposer *)amount;
    this_00[1].dependency.ptr = in_RCX;
    intermediate.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<unsigned_long>,kj::_::Void,kj::(anonymous_namespace)::PromiseIoStream::pumpTo(kj::AsyncOutputStream&,unsigned_long)::{lambda()#1},kj::_::PropagateException>>
          ::instance;
    intermediate.ptr = (PromiseNode *)this_00;
    _::maybeChain<unsigned_long>(&local_48,(Promise<unsigned_long> *)&intermediate);
    pPVar2 = local_48.ptr;
    local_38.disposer = local_48.disposer;
    local_48.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_48);
    (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
         (_func_int **)local_48.disposer;
    (this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream =
         (_func_int **)pPVar2;
    local_38.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_38);
    Own<kj::_::PromiseNode>::dispose(&intermediate);
    Own<kj::_::PromiseNode>::dispose(&OStack_68);
    pPVar2 = extraout_RDX_00;
  }
  else {
    (**(code **)(*pp_Var1 + 0x18))(this,pp_Var1,amount);
    pPVar2 = extraout_RDX;
  }
  PVar3.super_PromiseBase.node.ptr = pPVar2;
  PVar3.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar3.super_PromiseBase.node;
}

Assistant:

kj::Promise<uint64_t> pumpTo(kj::AsyncOutputStream& output, uint64_t amount) override {
    KJ_IF_MAYBE(s, stream) {
      return s->get()->pumpTo(output, amount);
    } else {
      return promise.addBranch().then([this,&output,amount]() {
        return KJ_ASSERT_NONNULL(stream)->pumpTo(output, amount);
      });
    }
  }